

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedreader.cpp
# Opt level: O0

ssize_t __thiscall
hbm::BufferedReader::recv(BufferedReader *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t retVal;
  iovec iov [2];
  size_t bytesLeft;
  iovec local_58;
  BufferedReader *local_48;
  undefined8 local_40;
  ulong local_30;
  ulong local_28;
  void *local_20;
  int local_14;
  BufferedReader *local_10;
  ulong local_8;
  
  local_30 = this->m_fillLevel - this->m_alreadyRead;
  local_28 = __n;
  local_20 = __buf;
  local_14 = __fd;
  local_10 = this;
  if (local_30 < __n) {
    if (local_30 == 0) {
      local_40 = 0x40000;
      local_58.iov_base = __buf;
      local_58.iov_len = __n;
      local_48 = this;
      local_8 = readv(__fd,&local_58,2);
      this->m_alreadyRead = 0;
      if ((long)local_28 < (long)local_8) {
        this->m_fillLevel = local_8 - local_28;
        local_8 = local_28;
      }
      else {
        this->m_fillLevel = 0;
      }
    }
    else {
      memcpy(__buf,this->m_buffer + this->m_alreadyRead,local_30);
      this->m_alreadyRead = this->m_fillLevel;
      local_8 = local_30;
    }
  }
  else {
    memcpy(__buf,this->m_buffer + this->m_alreadyRead,__n);
    this->m_alreadyRead = local_28 + this->m_alreadyRead;
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

ssize_t BufferedReader::recv(int sockfd, void *buf, size_t desiredLen)
	{
		// check whether there is something left
		size_t bytesLeft = m_fillLevel - m_alreadyRead;

		if(bytesLeft>=desiredLen) {
			// there is more than or as much as desired
			memcpy(buf, m_buffer+m_alreadyRead, desiredLen);
			m_alreadyRead += desiredLen;
			return static_cast < ssize_t > (desiredLen);
		} else if(bytesLeft>0) {
			// return the rest which is less than desired (a short read)
			memcpy(buf, m_buffer+m_alreadyRead, bytesLeft);
			m_alreadyRead = m_fillLevel;
			return static_cast < ssize_t > (bytesLeft);
		}

		// try to read as much as possible into the provided buffer.In addition we fill our internal buffer if there is already more to read.
		// readv saves us from reading into the internal buffer first and copying into the provided buffer afterwards.
		struct iovec iov[2];
		iov[0].iov_base = buf;
		iov[0].iov_len = desiredLen;
		iov[1].iov_base = m_buffer;
		iov[1].iov_len = sizeof(m_buffer);

		ssize_t retVal = ::readv(sockfd, iov, 2);
		m_alreadyRead = 0;

		if (retVal>static_cast < ssize_t > (desiredLen)) {
			// readv returns the total number of bytes read
			m_fillLevel = retVal-desiredLen;
			return static_cast < ssize_t > (desiredLen);
		}
		m_fillLevel = 0;
		return retVal;
	}